

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satMem.c
# Opt level: O3

Sat_MmFixed_t * Sat_MmFixedStart(int nEntrySize)

{
  Sat_MmFixed_t *pSVar1;
  char **ppcVar2;
  uint uVar3;
  
  pSVar1 = (Sat_MmFixed_t *)calloc(1,0x38);
  pSVar1->nEntrySize = nEntrySize;
  uVar3 = 0x400;
  if (0x3f < nEntrySize) {
    uVar3 = 8;
    if (8 < 0x10000U / (uint)nEntrySize) {
      uVar3 = 0x10000U / (uint)nEntrySize;
    }
  }
  pSVar1->nChunkSize = uVar3;
  pSVar1->nChunksAlloc = 0x40;
  pSVar1->nChunks = 0;
  ppcVar2 = (char **)malloc(0x200);
  pSVar1->pChunks = ppcVar2;
  pSVar1->nMemoryUsed = 0;
  pSVar1->nMemoryAlloc = 0;
  return pSVar1;
}

Assistant:

Sat_MmFixed_t * Sat_MmFixedStart( int nEntrySize )
{
    Sat_MmFixed_t * p;

    p = ABC_ALLOC( Sat_MmFixed_t, 1 );
    memset( p, 0, sizeof(Sat_MmFixed_t) );

    p->nEntrySize    = nEntrySize;
    p->nEntriesAlloc = 0;
    p->nEntriesUsed  = 0;
    p->pEntriesFree  = NULL;

    if ( nEntrySize * (1 << 10) < (1<<16) )
        p->nChunkSize = (1 << 10);
    else
        p->nChunkSize = (1<<16) / nEntrySize;
    if ( p->nChunkSize < 8 )
        p->nChunkSize = 8;

    p->nChunksAlloc  = 64;
    p->nChunks       = 0;
    p->pChunks       = ABC_ALLOC( char *, p->nChunksAlloc );

    p->nMemoryUsed   = 0;
    p->nMemoryAlloc  = 0;
    return p;
}